

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

void __thiscall coda_url::coda_url(coda_url *this,coda_url *u)

{
  bool bVar1;
  void *pvVar2;
  coda_url *in_RSI;
  long *in_RDI;
  
  bVar1 = empty(in_RSI);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 1) = 0;
    *(undefined4 *)(in_RDI + 3) = 0;
    *in_RDI = 0;
    in_RDI[2] = 0;
  }
  else {
    *(uint32_t *)(in_RDI + 1) = in_RSI->val_len;
    *(uint32_t *)(in_RDI + 3) = in_RSI->dom_len;
    pvVar2 = malloc((ulong)((int)in_RDI[1] + (int)in_RDI[3] + 2));
    *in_RDI = (long)pvVar2;
    memcpy((void *)*in_RDI,in_RSI->val_str,(ulong)((int)in_RDI[1] + (int)in_RDI[3] + 2));
    in_RDI[2] = *in_RDI + (ulong)*(uint *)(in_RDI + 1) + 1;
  }
  return;
}

Assistant:

coda_url::coda_url(const coda_url &u)
{
	if (u.empty())
	{
		val_len = 0;
		dom_len = 0;

		val_str = NULL;
		dom_str = NULL;
	}
	else
	{
		val_len = u.val_len;
		dom_len = u.dom_len;

		val_str = (char *) malloc(val_len + dom_len + 2);
		memcpy(val_str, u.val_str, val_len + dom_len + 2);

		dom_str = val_str + val_len + 1;
	}
}